

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::makeindex2pointmap(tetgenmesh *this,point **idx2verlist)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  point *ppdVar3;
  int local_24;
  point pdStack_20;
  int idx;
  point pointloop;
  point **idx2verlist_local;
  tetgenmesh *this_local;
  
  if (1 < this->b->verbose) {
    printf("  Constructing mapping from indices to points.\n");
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->points->items + 1;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppdVar3 = (point *)operator_new__(uVar2);
  *idx2verlist = ppdVar3;
  memorypool::traversalinit(this->points);
  pdStack_20 = pointtraverse(this);
  local_24 = this->in->firstnumber;
  while (pdStack_20 != (point)0x0) {
    (*idx2verlist)[local_24] = pdStack_20;
    pdStack_20 = pointtraverse(this);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void tetgenmesh::makeindex2pointmap(point*& idx2verlist)
{
  point pointloop;
  int idx;

  if (b->verbose > 1) {
    printf("  Constructing mapping from indices to points.\n");
  }

  idx2verlist = new point[points->items + 1];

  points->traversalinit();
  pointloop = pointtraverse();
  idx =  in->firstnumber;
  while (pointloop != (point) NULL) {
    idx2verlist[idx++] = pointloop;
    pointloop = pointtraverse();
  }
}